

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O3

uint crnlib::rg_etc1::pack_etc2_alpha
               (void *pBlock,uint *pSrc_pixels_rgba,etc2a_pack_params *pack_params)

{
  byte *pbVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  sbyte sVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined1 uVar10;
  uint s;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  undefined1 *puVar15;
  uint d0;
  uint uVar16;
  uint uVar17;
  uint i;
  int iVar19;
  uint uVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint8 data [8];
  uint8 values [8];
  results results;
  uint8 selectors [16];
  dxt5_endpoint_optimizer dxt5_optimizer;
  uint local_51c;
  byte bStack_517;
  undefined4 uStack_516;
  undefined2 uStack_512;
  uint local_50c;
  undefined8 *local_508;
  ulong local_500;
  undefined1 *local_4f8;
  long local_4f0;
  byte abStack_4e8 [8];
  results local_4e0;
  uint8 local_4c8 [24];
  params local_4b0;
  dxt5_endpoint_optimizer local_490;
  ulong uVar18;
  
  local_508 = (undefined8 *)pBlock;
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&local_490);
  local_4e0.m_pSelectors = local_4c8;
  local_4b0.m_block_index = 0;
  local_4b0.m_num_pixels = 0x10;
  local_4b0.m_comp_index = pack_params->comp_index;
  local_4b0.m_quality = cCRNDXTQualityUber;
  if (pack_params->m_quality != cHighQuality) {
    local_4b0.m_quality = (pack_params->m_quality == cMediumQuality) + cCRNDXTQualityFast;
  }
  local_4b0.m_use_both_block_types = false;
  local_4b0.m_pPixels = (color_quad_u8 *)pSrc_pixels_rgba;
  dxt5_endpoint_optimizer::compute(&local_490,&local_4b0,&local_4e0);
  local_50c = (uint)local_4e0.m_first_endpoint + (uint)local_4e0.m_second_endpoint + 1 >> 1;
  uVar11 = local_50c & 0xff;
  local_500 = (ulong)((uint)local_4e0.m_first_endpoint - (uint)local_4e0.m_second_endpoint);
  local_51c = 0xffffffff;
  puVar15 = g_etc2a_modifier_table;
  lVar9 = 0;
  do {
    iVar19 = *(int *)(g_etc2a_modifier_table + lVar9 * 0x20 + 0x1c);
    uVar7 = ((iVar19 >> 1) + (int)local_500 + iVar19) / (iVar19 * 2);
    if (0xe < (int)uVar7) {
      uVar7 = 0xf;
    }
    if ((int)uVar7 < 2) {
      uVar7 = 1;
    }
    uVar10 = (undefined1)local_50c;
    local_4f0 = lVar9;
    bStack_517 = (char)(uVar7 << 4) + (char)lVar9;
    uStack_512 = 0;
    uStack_516 = 0;
    lVar9 = 0;
    do {
      auVar23 = *(undefined1 (*) [16])(puVar15 + lVar9 * 4);
      auVar22._0_4_ = auVar23._0_4_ * uVar7 + uVar11;
      auVar22._4_4_ = auVar23._4_4_ * uVar7 + uVar11;
      auVar22._8_4_ = (int)((auVar23._8_8_ & 0xffffffff) * (ulong)uVar7) + uVar11;
      auVar22._12_4_ = auVar23._12_4_ * uVar7 + uVar11;
      auVar23 = packssdw(auVar22,auVar22);
      sVar2 = auVar23._0_2_;
      sVar3 = auVar23._2_2_;
      sVar4 = auVar23._4_2_;
      sVar5 = auVar23._6_2_;
      *(uint *)(abStack_4e8 + lVar9) =
           CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar23[6] - (0xff < sVar5),
                    CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar23[4] - (0xff < sVar4),
                             CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar23[2] - (0xff < sVar3),
                                      (0 < sVar2) * (sVar2 < 0x100) * auVar23[0] - (0xff < sVar2))))
      ;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 8);
    local_4f8 = puVar15;
    uVar16 = 3;
    iVar19 = 0;
    uVar7 = 0;
    uVar18 = 0;
    do {
      uVar21 = (int)uVar18 + 4;
      uVar20 = uVar16;
      do {
        uVar12 = 0;
        uVar17 = 0xffffffff;
        uVar13 = 0;
        do {
          uVar8 = (uint)*(byte *)((long)pSrc_pixels_rgba + uVar18 * 4 + 3) -
                  (uint)abStack_4e8[uVar12];
          uVar14 = -uVar8;
          if (0 < (int)uVar8) {
            uVar14 = uVar8;
          }
          if (uVar14 < uVar17) {
            uVar13 = uVar12 & 0xffffffff;
            uVar17 = uVar14;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != 8);
        sVar6 = (sbyte)(uVar20 & 7);
        pbVar1 = (byte *)((long)&uStack_516 + (ulong)(uVar20 >> 3));
        *pbVar1 = *pbVar1 | (byte)((uint)uVar13 << (8U - sVar6 & 0x1f));
        if ((uVar20 & 7) < 3) {
          (&bStack_517)[uVar20 >> 3] = (&bStack_517)[uVar20 >> 3] | (byte)((uint)uVar13 >> sVar6);
        }
        uVar7 = uVar7 + uVar17 * uVar17;
        uVar17 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar17;
        uVar20 = uVar20 + 0xc;
      } while (uVar17 != uVar21);
      iVar19 = iVar19 + 1;
      uVar16 = uVar16 + 3;
      uVar18 = (ulong)uVar21;
    } while (iVar19 != 4);
    if (uVar7 < local_51c) {
      *local_508 = CONCAT26(uStack_512,CONCAT42(uStack_516,CONCAT11(bStack_517,uVar10)));
      local_51c = uVar7;
    }
    lVar9 = local_4f0 + 1;
    puVar15 = local_4f8 + 0x20;
  } while (lVar9 != 0x10);
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&local_490);
  return local_51c;
}

Assistant:

unsigned int pack_etc2_alpha(void* pBlock, const unsigned int* pSrc_pixels_rgba, etc2a_pack_params& pack_params)
        {
            crnlib::color_quad_u8* pixels = (crnlib::color_quad_u8*)pSrc_pixels_rgba;
            dxt5_endpoint_optimizer dxt5_optimizer;

            dxt5_endpoint_optimizer::results results;
            uint8 selectors[16];
            results.m_pSelectors = selectors;

            dxt5_endpoint_optimizer::params params;
            params.m_pPixels = pixels;
            params.m_num_pixels = 16;
            params.m_comp_index = pack_params.comp_index;
            params.m_quality = pack_params.m_quality == cHighQuality ? cCRNDXTQualityUber : pack_params.m_quality == cMediumQuality ? cCRNDXTQualityNormal
                                                                                                                                    : cCRNDXTQualityFast;
            params.m_use_both_block_types = false;
            dxt5_optimizer.compute(params, results);

            uint base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
            uint best_error = cUINT32_MAX;
            for (int modifier_index = 0; modifier_index < 16; modifier_index++)
            {
                const int* modifier = g_etc2a_modifier_table[modifier_index];
                int multiplier = math::clamp<int>((results.m_first_endpoint - results.m_second_endpoint + modifier[7] + (modifier[7] >> 1)) / (modifier[7] << 1), 1, 15);
                uint8 data[8] = { (uint8)base_codeword, (uint8)(multiplier << 4 | modifier_index) }, values[8];
                for (int i = 0; i < 8; i++)
                {
                    values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
                }
                uint error = 0;
                for (uint d0 = 3, t = 0, i = 0; i < 4; i++, d0 += 3)
                {
                    for (uint d = d0, j = 0; j < 4; j++, t++, d += 12)
                    {
                        int a = pixels[t].a;
                        uint byte_offset = 2 + (d >> 3);
                        uint bit_offset = d & 7;
                        uint best_s = 0;
                        uint best_delta = cUINT32_MAX;
                        for (uint s = 0; s < 8; s++)
                        {
                            uint delta = abs(a - values[s]);
                            if (delta < best_delta)
                            {
                                best_s = s;
                                best_delta = delta;
                            }
                        }
                        error += best_delta * best_delta;
                        data[byte_offset] |= best_s << (8 - bit_offset);
                        if (bit_offset < 3)
                        {
                            data[byte_offset - 1] |= best_s >> bit_offset;
                        }
                    }
                }
                if (error < best_error)
                {
                    memcpy(pBlock, data, 8);
                    best_error = error;
                }
            }

            return best_error;
        }